

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

void av1_get_tpl_stats_sb
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,SuperBlockEnc *sb_enc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  FRAME_UPDATE_TYPE FVar6;
  BLOCK_SIZE BVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  undefined8 *puVar15;
  int in_ECX;
  int in_EDX;
  byte in_SIL;
  long *in_RDI;
  long in_R8;
  TplDepStats *this_stats;
  int i;
  int col;
  int row;
  int col_step_sr;
  int row_step;
  BLOCK_SIZE tpl_bsize;
  int mi_cols_sr;
  int mi_col_end_sr;
  int mi_col_sr;
  int count;
  int mi_count;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  int mi_high;
  int mi_wide;
  TplParams *tpl_data;
  int gf_group_index;
  AV1_COMMON *cm;
  FRAME_UPDATE_TYPE update_type;
  int local_88;
  int local_84;
  int local_80;
  int local_64;
  int local_60;
  
  *(undefined4 *)(in_R8 + 4) = 0;
  if (((((*(byte *)((long)in_RDI + 0x42361) & 1) != 0) && ((char)in_RDI[0x77f0] != '\0')) &&
      (FVar6 = get_frame_update_type((GF_GROUP *)(*in_RDI + 400),(uint)*(byte *)(in_RDI + 0xe258)),
      FVar6 != '\x05')) && (FVar6 != '\x04')) {
    bVar1 = *(byte *)(in_RDI + 0xe258);
    lVar4 = *in_RDI;
    iVar8 = av1_tpl_stats_ready((TplParams *)(lVar4 + 0xd2a8),(uint)bVar1);
    if (iVar8 != 0) {
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_SIL];
      bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_SIL];
      lVar14 = *(long *)(lVar4 + 0x12298) + (long)(int)(uint)bVar1 * 0x60;
      lVar5 = *(long *)(lVar14 + 8);
      iVar8 = *(int *)(lVar14 + 0x40);
      local_60 = 0;
      local_64 = 0;
      iVar9 = coded_to_superres_mi(in_ECX,(uint)*(byte *)(in_RDI + 0x77fa));
      iVar10 = coded_to_superres_mi(in_ECX + (uint)bVar2,(uint)*(byte *)(in_RDI + 0x77fa));
      iVar11 = av1_pixels_to_mi((int)in_RDI[0x77f9]);
      BVar7 = convert_length_to_bsize((uint)*(byte *)(lVar4 + 0xd2ad));
      bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[BVar7];
      iVar12 = coded_to_superres_mi
                         ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                [BVar7],(uint)*(byte *)(in_RDI + 0x77fa));
      *(int *)(in_R8 + 0xb08) = (iVar10 - iVar9) / iVar12;
      for (local_80 = in_EDX; local_84 = iVar9, local_80 < (int)(in_EDX + (uint)bVar3);
          local_80 = (uint)bVar1 + local_80) {
        for (; local_84 < iVar10; local_84 = iVar12 + local_84) {
          if ((local_80 < *(int *)((long)in_RDI + 0x3c194)) && (local_84 < iVar11)) {
            iVar13 = av1_tpl_ptr_pos(local_80,local_84,iVar8,*(uint8_t *)(lVar4 + 0xd2ac));
            lVar14 = lVar5 + (long)iVar13 * 200;
            *(long *)(in_R8 + 8 + (long)local_64 * 8) = (long)(*(int *)(lVar14 + 0x8c) << 4);
            *(long *)(in_R8 + 0x208 + (long)local_64 * 8) = (long)(*(int *)(lVar14 + 0x88) << 4);
            puVar15 = (undefined8 *)(in_R8 + 0x408 + (long)local_64 * 0x1c);
            *puVar15 = *(undefined8 *)(lVar14 + 0xa4);
            puVar15[1] = *(undefined8 *)(lVar14 + 0xac);
            puVar15[2] = *(undefined8 *)(lVar14 + 0xb4);
            *(undefined4 *)(puVar15 + 3) = *(undefined4 *)(lVar14 + 0xbc);
            local_60 = local_60 + 1;
          }
          else {
            *(undefined8 *)(in_R8 + 8 + (long)local_64 * 8) = 0x7fffffffffffffff;
            *(undefined8 *)(in_R8 + 0x208 + (long)local_64 * 8) = 0x7fffffffffffffff;
            for (local_88 = 0; local_88 < 7; local_88 = local_88 + 1) {
              *(undefined4 *)(in_R8 + 0x408 + (long)local_64 * 0x1c + (long)local_88 * 4) =
                   0x80008000;
            }
          }
          local_64 = local_64 + 1;
        }
      }
      *(int *)(in_R8 + 4) = local_60;
    }
  }
  return;
}

Assistant:

void av1_get_tpl_stats_sb(AV1_COMP *cpi, BLOCK_SIZE bsize, int mi_row,
                          int mi_col, SuperBlockEnc *sb_enc) {
  sb_enc->tpl_data_count = 0;

  if (!cpi->oxcf.algo_cfg.enable_tpl_model) return;
  if (cpi->common.current_frame.frame_type == KEY_FRAME) return;
  const FRAME_UPDATE_TYPE update_type =
      get_frame_update_type(&cpi->ppi->gf_group, cpi->gf_frame_index);
  if (update_type == INTNL_OVERLAY_UPDATE || update_type == OVERLAY_UPDATE)
    return;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));

  AV1_COMMON *const cm = &cpi->common;
  const int gf_group_index = cpi->gf_frame_index;
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  if (!av1_tpl_stats_ready(tpl_data, gf_group_index)) return;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_group_index];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;
  int tpl_stride = tpl_frame->stride;

  int mi_count = 0;
  int count = 0;
  const int mi_col_sr =
      coded_to_superres_mi(mi_col, cm->superres_scale_denominator);
  const int mi_col_end_sr =
      coded_to_superres_mi(mi_col + mi_wide, cm->superres_scale_denominator);
  // mi_cols_sr is mi_cols at superres case.
  const int mi_cols_sr = av1_pixels_to_mi(cm->superres_upscaled_width);

  // TPL store unit size is not the same as the motion estimation unit size.
  // Here always use motion estimation size to avoid getting repetitive inter/
  // intra cost.
  const BLOCK_SIZE tpl_bsize = convert_length_to_bsize(tpl_data->tpl_bsize_1d);
  assert(mi_size_wide[tpl_bsize] == mi_size_high[tpl_bsize]);
  const int row_step = mi_size_high[tpl_bsize];
  const int col_step_sr = coded_to_superres_mi(mi_size_wide[tpl_bsize],
                                               cm->superres_scale_denominator);

  // Stride is only based on SB size, and we fill in values for every 16x16
  // block in a SB.
  sb_enc->tpl_stride = (mi_col_end_sr - mi_col_sr) / col_step_sr;

  for (int row = mi_row; row < mi_row + mi_high; row += row_step) {
    for (int col = mi_col_sr; col < mi_col_end_sr; col += col_step_sr) {
      assert(count < MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
      // Handle partial SB, so that no invalid values are used later.
      if (row >= cm->mi_params.mi_rows || col >= mi_cols_sr) {
        sb_enc->tpl_inter_cost[count] = INT64_MAX;
        sb_enc->tpl_intra_cost[count] = INT64_MAX;
        for (int i = 0; i < INTER_REFS_PER_FRAME; ++i) {
          sb_enc->tpl_mv[count][i].as_int = INVALID_MV;
        }
        count++;
        continue;
      }

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      sb_enc->tpl_inter_cost[count] = this_stats->inter_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      sb_enc->tpl_intra_cost[count] = this_stats->intra_cost
                                      << TPL_DEP_COST_SCALE_LOG2;
      memcpy(sb_enc->tpl_mv[count], this_stats->mv, sizeof(this_stats->mv));
      mi_count++;
      count++;
    }
  }

  assert(mi_count <= MAX_TPL_BLK_IN_SB * MAX_TPL_BLK_IN_SB);
  sb_enc->tpl_data_count = mi_count;
}